

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

string * __thiscall
el::base::utils::DateTime::timevalToString_abi_cxx11_
          (string *__return_storage_ptr__,DateTime *this,timeval tval,char *format,
          SubsecondPrecision *ssPrec)

{
  size_t sVar1;
  char buff_ [30];
  tm timeInfo;
  DateTime *local_88;
  undefined6 uStack_80;
  undefined2 uStack_7a;
  undefined6 uStack_78;
  undefined8 uStack_72;
  tm local_68;
  
  local_88 = this;
  localtime_r((time_t *)&local_88,&local_68);
  uStack_78 = 0;
  uStack_72 = 0;
  local_88 = (DateTime *)0x0;
  uStack_80 = 0;
  uStack_7a = 0;
  parseFormat((char *)&local_88,0x1e,(char *)tval.tv_usec,(tm *)&local_68,
              tval.tv_sec / (long)(ulong)*(uint *)(format + 4),(SubsecondPrecision *)format);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen((char *)&local_88);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,&local_88,(long)&local_88 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string DateTime::timevalToString(struct timeval tval, const char* format,
                                      const el::base::SubsecondPrecision* ssPrec) {
  struct ::tm timeInfo;
  buildTimeInfo(&tval, &timeInfo);
  const int kBuffSize = 30;
  char buff_[kBuffSize] = "";
  parseFormat(buff_, kBuffSize, format, &timeInfo, static_cast<std::size_t>(tval.tv_usec / ssPrec->m_offset),
              ssPrec);
  return std::string(buff_);
}